

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

RecyclableObject *
Js::JavascriptArray::ObjectSpliceHelper<unsigned_int>
          (RecyclableObject *pObj,uint len,uint start,uint deleteLen,Var *insertArgs,
          uint32 insertLen,ScriptContext *scriptContext,RecyclableObject *pNewObj)

{
  BOOL BVar1;
  JavascriptArray *pJVar2;
  Var pvVar3;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  uint32 i;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint32 uVar9;
  BigIndex index;
  BigIndex idxDest;
  BigIndex local_b8;
  Var *local_a8;
  BigIndex local_a0;
  JavascriptArray *local_90;
  ulong local_88;
  ulong local_80;
  ScriptContext *local_78;
  ThrowTypeErrorOnFailureHelper h;
  undefined1 local_58 [8];
  JsReentLock jsReentLock;
  
  local_88 = CONCAT44(in_register_00000014,start);
  jsReentLock._28_4_ = in_register_0000000c;
  jsReentLock._24_4_ = deleteLen;
  local_58 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_58)->noJsReentrancy;
  ((ThreadContext *)local_58)->noJsReentrancy = true;
  local_a8 = insertArgs;
  JsReentLock::setObjectForMutation((JsReentLock *)local_58,pObj);
  h.m_functionName = (PCWSTR)pNewObj;
  if (pNewObj == (RecyclableObject *)0x0) {
    *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    insertArgs = (Var *)0x0;
    h.m_functionName =
         (PCWSTR)ArraySpeciesCreate<unsigned_int>
                           (pObj,jsReentLock._24_4_,scriptContext,(bool *)0x0,(bool *)0x0,
                            (bool *)0x0);
    *(bool *)((long)local_58 + 0x108) = true;
    if ((RecyclableObject *)h.m_functionName == (RecyclableObject *)0x0) {
      h.m_functionName =
           (PCWSTR)JavascriptLibrary::CreateArray
                             ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                              jsReentLock._24_4_);
      EnsureHead<void*>((JavascriptArray *)h.m_functionName);
    }
  }
  pJVar2 = TryVarToNonES5Array(h.m_functionName);
  local_90 = pJVar2;
  local_80 = (ulong)insertLen;
  if (pJVar2 == (JavascriptArray *)0x0) {
    BigIndex::BigIndex((BigIndex *)&local_78,0);
    uVar8 = local_88 & 0xffffffff;
    uVar7 = jsReentLock._24_8_ & 0xffffffff;
    while (iVar5 = (int)uVar7, uVar7 = (ulong)(iVar5 - 1), iVar5 != 0) {
      *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      uVar9 = (uint32)uVar8;
      BVar1 = JavascriptOperators::HasItem(pObj,uVar9);
      JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      *(bool *)((long)local_58 + 0x108) = true;
      if (BVar1 != 0) {
        *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pvVar3 = JavascriptOperators::GetItem(pObj,uVar9,scriptContext);
        idxDest.bigIndex = (uint64)pvVar3;
        idxDest._0_8_ = h.m_scriptContext;
        uVar4 = SetArrayLikeObjects((JavascriptArray *)h.m_functionName,
                                    (RecyclableObject *)((ulong)local_78 & 0xffffffff),idxDest,
                                    insertArgs);
        index.bigIndex = (uint64)insertArgs;
        index._0_8_ = h.m_scriptContext;
        ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar4,(BOOL)scriptContext,
                            (ScriptContext *)((ulong)local_78 & 0xffffffff),index);
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
        *(bool *)((long)local_58 + 0x108) = true;
      }
      if ((uint32)local_78 == 0xffffffff) {
        h.m_scriptContext =
             (ScriptContext *)
             ((long)&((h.m_scriptContext)->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1);
      }
      else {
        local_78 = (ScriptContext *)CONCAT44(local_78._4_4_,(uint32)local_78 + 1);
      }
      uVar8 = (ulong)(uVar9 + 1);
    }
  }
  else {
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pJVar2);
    JsReentLock::setSecondObjectForMutation((JsReentLock *)local_58,pJVar2);
    for (uVar4 = 0; jsReentLock._24_4_ != uVar4; uVar4 = uVar4 + 1) {
      *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      uVar9 = (int)local_88 + uVar4;
      BVar1 = JavascriptOperators::HasItem(pObj,uVar9);
      JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      *(bool *)((long)local_58 + 0x108) = true;
      if (BVar1 != 0) {
        *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pvVar3 = JavascriptOperators::GetItem(pObj,uVar9,scriptContext);
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
        *(bool *)((long)local_58 + 0x108) = true;
        (*(local_90->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (local_90,(ulong)uVar4,pvVar3,0);
      }
    }
  }
  local_78 = scriptContext;
  h.m_scriptContext = (ScriptContext *)anon_var_dwarf_6940f86;
  uVar4 = (uint)local_80;
  iVar5 = (int)local_88;
  if ((uint)jsReentLock._24_4_ < uVar4) {
    *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    BigIndex::BigIndex(&local_a0,uVar4 + iVar5);
    Unshift<Js::JavascriptArray::BigIndex,unsigned_int>
              (pObj,&local_a0,jsReentLock._24_4_ + iVar5,len,scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)local_58);
    *(bool *)((long)local_58 + 0x108) = true;
  }
  else {
    if (uVar4 < (uint)jsReentLock._24_4_) {
      uVar9 = uVar4 + iVar5;
      for (uVar4 = jsReentLock._24_4_ + iVar5; uVar4 < len; uVar4 = uVar4 + 1) {
        *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar1 = JavascriptOperators::HasItem(pObj,uVar4);
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
        *(bool *)((long)local_58 + 0x108) = true;
        *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        if (BVar1 == 0) {
          BVar1 = JavascriptOperators::DeleteItem
                            (pObj,uVar9,PropertyOperation_ThrowOnDeleteIfNotConfig);
          ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                    ((ThrowTypeErrorOnFailureHelper *)&local_78,BVar1);
          JsReentLock::MutateArrayObject((JsReentLock *)local_58);
        }
        else {
          pvVar3 = JavascriptOperators::GetItem(pObj,uVar4,scriptContext);
          BVar1 = JavascriptOperators::SetItem
                            (pObj,pObj,uVar9,pvVar3,scriptContext,
                             PropertyOperation_ThrowIfNotExtensible,0);
          ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                    ((ThrowTypeErrorOnFailureHelper *)&local_78,BVar1);
          JsReentLock::MutateArrayObject((JsReentLock *)local_58);
        }
        *(bool *)((long)local_58 + 0x108) = true;
        uVar9 = uVar9 + 1;
      }
      uVar6 = (len - jsReentLock._24_4_) + (int)local_80;
      uVar4 = len;
      while (uVar6 < uVar4) {
        *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        uVar4 = uVar4 - 1;
        BVar1 = JavascriptOperators::DeleteItem
                          (pObj,uVar4,PropertyOperation_ThrowOnDeleteIfNotConfig);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&local_78,BVar1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
        *(bool *)((long)local_58 + 0x108) = true;
      }
    }
    if ((int)local_80 == 0) goto LAB_00a5ef3a;
  }
  uVar8 = local_80 & 0xffffffff;
  iVar5 = (int)local_88;
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    BigIndex::BigIndex(&local_a0,iVar5 + (int)uVar7);
    BVar1 = BigIndex::SetItem(&local_a0,pObj,local_a8[uVar7],PropertyOperation_ThrowIfNotExtensible)
    ;
    ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
              ((ThrowTypeErrorOnFailureHelper *)&local_78,BVar1);
    JsReentLock::MutateArrayObject((JsReentLock *)local_58);
    *(bool *)((long)local_58 + 0x108) = true;
  }
LAB_00a5ef3a:
  *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  BigIndex::BigIndex(&local_a0,(len - jsReentLock._24_4_) + (int)local_80);
  pvVar3 = BigIndex::ToNumber(&local_a0,scriptContext);
  BVar1 = JavascriptOperators::SetProperty
                    (pObj,pObj,0xd1,pvVar3,scriptContext,PropertyOperation_ThrowIfNotExtensible);
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
            ((ThrowTypeErrorOnFailureHelper *)&local_78,BVar1);
  BigIndex::BigIndex(&local_b8,jsReentLock._24_4_);
  pJVar2 = local_90;
  pvVar3 = BigIndex::ToNumber(&local_b8,scriptContext);
  BVar1 = JavascriptOperators::SetProperty
                    (h.m_functionName,(RecyclableObject *)h.m_functionName,0xd1,pvVar3,scriptContext
                     ,PropertyOperation_ThrowIfNotExtensible);
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
            ((ThrowTypeErrorOnFailureHelper *)&local_78,BVar1);
  JsReentLock::MutateArrayObject((JsReentLock *)local_58);
  *(bool *)((long)local_58 + 0x108) = true;
  if (pJVar2 != (JavascriptArray *)0x0) {
    (*(pJVar2->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(pJVar2);
  }
  ((ThreadContext *)local_58)->noJsReentrancy = (bool)jsReentLock.m_arrayObject2._0_1_;
  return (RecyclableObject *)h.m_functionName;
}

Assistant:

RecyclableObject* JavascriptArray::ObjectSpliceHelper(RecyclableObject* pObj, T len, T start,
        T deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext, RecyclableObject* pNewObj)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pObj);

        JavascriptArray *pnewArr = nullptr;

        if (pNewObj == nullptr)
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, pNewObj = ArraySpeciesCreate(pObj, deleteLen, scriptContext));
            if (pNewObj == nullptr)
            {
                if (deleteLen > UINT_MAX)
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
                }

                pnewArr = scriptContext->GetLibrary()->CreateArray(static_cast<uint32>(deleteLen));
                pnewArr->EnsureHead<Var>();

                pNewObj = pnewArr;
            }
        }

        pnewArr = JavascriptArray::TryVarToNonES5Array(pNewObj);
        if (pnewArr)
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pnewArr);
#endif
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, pnewArr);
        }

        // copy elements to delete to new array
        if (pnewArr != nullptr)
        {
            for (uint32 i = 0; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    JS_REENTRANT(jsReentLock, Var element = JavascriptOperators::GetItem(pObj, start + i, scriptContext));
                    pnewArr->SetItem(i, element, PropertyOperation_None);
                }
            }
        }
        else
        {
            BigIndex k = 0u;
            for (T i = 0u; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, start + i, scriptContext),
                        ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(pNewObj, k, element), scriptContext, k));
                }
                ++k;
            }
        }

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.splice"));

        // Now we need reserve room if it is necessary
        if (insertLen > deleteLen) // Might overflow max array length
        {
            // Unshift [start + deleteLen, len) to start + insertLen
            JS_REENTRANT(jsReentLock, Unshift<BigIndex, T>(pObj, start + insertLen, start + deleteLen, len, scriptContext));
        }
        else if (insertLen < deleteLen) // Won't overflow max array length
        {
            T j = 0;
            for (T i = start + deleteLen; i < len; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, i, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(pObj, pObj, start + insertLen + j, element, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, start + insertLen + j, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
                j++;
            }

            // Clean up the rest
            for (T i = len; i > len - deleteLen + insertLen; i--)
            {
                JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, i - 1, PropertyOperation_ThrowOnDeleteIfNotConfig)));
            }
        }

        if (insertLen > 0)
        {
            T dstIndex = start; // insert index might overflow max array length
            for (uint32 i = 0; i < insertLen; i++)
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(IndexTrace<BigIndex>::SetItem(pObj, dstIndex, insertArgs[i], PropertyOperation_ThrowIfNotExtensible)));
                ++dstIndex;
            }
        }

        // Set up new length
        T newLen = T(len - deleteLen) + insertLen;
        JS_REENTRANT(jsReentLock,
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pObj, pObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(newLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)),
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pNewObj, pNewObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(deleteLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
#ifdef VALIDATE_ARRAY
        if (pnewArr)
        {
            pnewArr->ValidateArray();
        }
#endif
        return pNewObj;
    }